

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statisticspooling.cpp
# Opt level: O0

int __thiscall
ncnn::StatisticsPooling::forward(StatisticsPooling *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  long *in_RDX;
  long *in_RSI;
  long in_RDI;
  float fVar1;
  int i_1;
  float std;
  float *ptr_1;
  int q_1;
  int i;
  float mean;
  float *ptr;
  int q;
  int out_channels;
  size_t elemsize;
  int size;
  int channels;
  int h;
  int w;
  Mat *m_1;
  Mat *m;
  Allocator *in_stack_fffffffffffffcf8;
  size_t in_stack_fffffffffffffd00;
  undefined8 in_stack_fffffffffffffd08;
  Mat *in_stack_fffffffffffffd10;
  int local_2c0;
  float local_2bc;
  undefined8 local_2b8;
  undefined8 local_2b0;
  undefined8 local_2a8;
  undefined4 local_2a0;
  long local_298;
  undefined4 local_290;
  undefined4 local_28c;
  undefined4 local_288;
  undefined4 local_284;
  undefined4 local_280;
  undefined8 local_278;
  long local_270;
  int local_268;
  int local_264;
  float local_260;
  undefined8 local_250;
  undefined8 local_248;
  undefined8 local_240;
  undefined4 local_238;
  long local_230;
  undefined4 local_228;
  undefined4 local_224;
  undefined4 local_220;
  undefined4 local_21c;
  undefined4 local_218;
  undefined8 local_210;
  long local_208;
  int local_200;
  int local_1fc;
  long local_1f8;
  int local_1f0;
  int local_1ec;
  int local_1e8;
  int local_1e4;
  long *local_1d8;
  long *local_1d0;
  undefined1 local_1bd;
  int local_1bc;
  undefined8 *local_1b0;
  undefined1 local_1a5;
  int local_1a4;
  undefined8 *local_198;
  undefined8 *local_190;
  undefined8 *local_188;
  undefined8 *local_170;
  undefined8 *local_160;
  long local_150;
  long local_140;
  long *local_138;
  long local_130;
  long local_120;
  undefined4 local_114;
  long local_110;
  long local_108;
  undefined4 local_fc;
  int local_f8;
  int local_f4;
  undefined8 *local_f0;
  long local_e8;
  undefined4 local_dc;
  long local_d8;
  long local_d0;
  undefined4 local_c4;
  int local_c0;
  int local_bc;
  undefined8 *local_b8;
  undefined4 local_ac;
  long local_a8;
  undefined4 local_9c;
  long local_98;
  undefined8 *local_78;
  undefined8 *local_58;
  
  local_1e4 = *(int *)((long)in_RSI + 0x2c);
  local_1e8 = (int)in_RSI[6];
  local_1ec = (int)in_RSI[7];
  local_1f0 = local_1e4 * local_1e8;
  local_1f8 = in_RSI[2];
  local_1fc = local_1ec;
  if (*(int *)(in_RDI + 0xd0) != 0) {
    local_1fc = local_1ec << 1;
  }
  local_1d8 = in_RDX;
  local_1d0 = in_RSI;
  Mat::create(in_stack_fffffffffffffd10,(int)((ulong)in_stack_fffffffffffffd08 >> 0x20),
              in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
  for (local_200 = 0; local_200 < local_1ec; local_200 = local_200 + 1) {
    local_198 = &local_250;
    local_f4 = *(int *)((long)local_1d0 + 0x2c);
    local_f8 = (int)local_1d0[6];
    local_fc = *(undefined4 *)((long)local_1d0 + 0x34);
    local_208 = *local_1d0 + local_1d0[8] * (long)local_200 * local_1d0[2];
    local_110 = local_1d0[2];
    local_114 = (undefined4)local_1d0[3];
    local_120 = local_1d0[4];
    local_f0 = &local_250;
    local_98 = (long)local_f4 * (long)local_f8 * local_110;
    local_9c = 0x10;
    local_1a4 = local_200;
    local_1a5 = 1;
    local_188 = &local_250;
    local_170 = &local_250;
    local_250 = 0;
    local_240 = 0;
    local_238 = 0;
    local_228 = 0;
    local_224 = 0;
    local_220 = 0;
    local_21c = 0;
    local_218 = 0;
    local_210 = 0;
    local_248 = 0;
    local_260 = 0.0;
    for (local_264 = 0; local_264 < local_1f0; local_264 = local_264 + 1) {
      local_260 = *(float *)(local_208 + (long)local_264 * 4) + local_260;
    }
    local_130 = (long)local_200;
    *(float *)(*local_1d8 + local_130 * 4) = (local_260 / (float)local_1e4) / (float)local_1e8;
    local_108 = local_208;
    local_58 = local_170;
    local_230 = local_120;
  }
  for (local_268 = local_1ec; local_268 < local_1fc; local_268 = local_268 + 1) {
    local_1bc = local_268 - local_1ec;
    local_1b0 = &local_2b8;
    local_bc = *(int *)((long)local_1d0 + 0x2c);
    local_c0 = (int)local_1d0[6];
    local_c4 = *(undefined4 *)((long)local_1d0 + 0x34);
    local_270 = *local_1d0 + local_1d0[8] * (long)local_1bc * local_1d0[2];
    local_d8 = local_1d0[2];
    local_dc = (undefined4)local_1d0[3];
    local_e8 = local_1d0[4];
    local_b8 = &local_2b8;
    local_a8 = (long)local_bc * (long)local_c0 * local_d8;
    local_190 = &local_2b8;
    local_160 = &local_2b8;
    local_ac = 0x10;
    local_1bd = 1;
    local_2b8 = 0;
    local_2a8 = 0;
    local_2a0 = 0;
    local_290 = 0;
    local_28c = 0;
    local_288 = 0;
    local_284 = 0;
    local_280 = 0;
    local_278 = 0;
    local_2b0 = 0;
    local_2bc = 0.0;
    local_d0 = local_270;
    local_78 = local_160;
    local_298 = local_e8;
    for (local_2c0 = 0; local_2c0 < local_1f0; local_2c0 = local_2c0 + 1) {
      local_140 = (long)(local_268 - local_1ec);
      local_138 = local_1d8;
      fVar1 = powf(*(float *)(local_270 + (long)local_2c0 * 4) -
                   *(float *)(*local_1d8 + local_140 * 4),2.0);
      local_2bc = fVar1 + local_2bc;
    }
    local_150 = (long)local_268;
    *(float *)(*local_1d8 + local_150 * 4) = SQRT((local_2bc / (float)local_1e4) / (float)local_1e8)
    ;
  }
  return 0;
}

Assistant:

int StatisticsPooling::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    int size = w * h;
    size_t elemsize = bottom_blob.elemsize;

    int out_channels = channels;
    if (include_stddev)
    {
        out_channels *= 2;
    }

    top_blob.create(out_channels, elemsize, opt.blob_allocator);

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* ptr = bottom_blob.channel(q);

        float mean = 0.f;
        for (int i = 0; i < size; i++)
        {
            mean += ptr[i];
        }
        top_blob[q] = mean / w / h;
    }

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = channels; q < out_channels; q++)
    {
        const float* ptr = bottom_blob.channel(q - channels);

        float std = 0.f;
        for (int i = 0; i < size; i++)
        {
            std += powf((ptr[i] - top_blob[q - channels]), 2);
        }
        top_blob[q] = sqrtf(std / w / h);
    }

    return 0;
}